

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  sqlite3_stmt *pStmt;
  int ret;
  char *apValue_local;
  int aIndex_local;
  Statement *this_local;
  
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  aRet = sqlite3_bind_text(pStmt,__fd,(char *)__addr,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const char* apValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, apValue, -1, SQLITE_TRANSIENT);
    check(ret);
}